

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O2

int evmap_signal_check_integrity_fn(event_base *base,int signum,evmap_signal *sig_info,void *arg)

{
  event *peVar1;
  anon_union_32_2_36317463_for_ev_ *paVar2;
  event *peVar3;
  undefined8 uVar4;
  char *pcVar5;
  bool bVar6;
  
  peVar1 = (sig_info->events).lh_first;
  peVar3 = peVar1;
  if (peVar1 == (event *)0x0) {
LAB_002688af:
    do {
      peVar3 = (((anon_struct_32_2_255328d7_for_ev_io *)sig_info)->ev_io_next).le_next;
      if (peVar3 == (event *)0x0) {
        return 0;
      }
      if (((peVar3->ev_evcallback).evcb_flags & 2) == 0) {
        pcVar5 = "ev->ev_flags & EVLIST_INSERTED";
        uVar4 = 0x3e1;
        goto LAB_00268959;
      }
      if (peVar3->ev_fd != signum) {
        pcVar5 = "ev->ev_fd == signum";
        uVar4 = 0x3e2;
        goto LAB_00268959;
      }
      if ((peVar3->ev_events & 8U) == 0) {
        pcVar5 = "(ev->ev_events & EV_SIGNAL)";
        uVar4 = 0x3e3;
        goto LAB_00268959;
      }
      sig_info = (evmap_signal *)&peVar3->ev_;
    } while ((peVar3->ev_events & 0x86U) == 0);
    pcVar5 = "!(ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED))";
    uVar4 = 0x3e4;
    goto LAB_00268959;
  }
  do {
    paVar2 = (anon_union_32_2_36317463_for_ev_ *)sig_info;
    if ((peVar1 == (event *)0x0) ||
       (peVar3 = (peVar3->ev_).ev_io.ev_io_next.le_next, peVar3 == (event *)0x0)) goto LAB_00268850;
    if (peVar1 == peVar3) break;
    peVar3 = (peVar3->ev_).ev_io.ev_io_next.le_next;
    if (peVar3 == (event *)0x0) goto LAB_00268850;
    peVar1 = (peVar1->ev_).ev_io.ev_io_next.le_next;
  } while (peVar1 != peVar3);
  pcVar5 = "elm1 != elm2";
  goto LAB_0026887a;
  while (bVar6 = paVar2 == (anon_union_32_2_36317463_for_ev_ *)
                           (peVar3->ev_).ev_io.ev_io_next.le_prev, paVar2 = &peVar3->ev_, bVar6) {
LAB_00268850:
    peVar3 = ((event_dlist *)&(paVar2->ev_io).ev_io_next)->lh_first;
    if (peVar3 == (event *)0x0) goto LAB_002688af;
  }
  pcVar5 = "nextp == elm1->ev_.ev_signal.ev_signal_next.le_prev";
LAB_0026887a:
  uVar4 = 0x3de;
LAB_00268959:
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
             ,uVar4,pcVar5,"evmap_signal_check_integrity_fn");
}

Assistant:

static int
evmap_signal_check_integrity_fn(struct event_base *base,
    int signum, struct evmap_signal *sig_info, void *arg)
{
	struct event *ev;
	/* First, make sure the list itself isn't corrupt. */
	EVUTIL_ASSERT_LIST_OK(&sig_info->events, event, ev_signal_next);

	LIST_FOREACH(ev, &sig_info->events, ev_io_next) {
		EVUTIL_ASSERT(ev->ev_flags & EVLIST_INSERTED);
		EVUTIL_ASSERT(ev->ev_fd == signum);
		EVUTIL_ASSERT((ev->ev_events & EV_SIGNAL));
		EVUTIL_ASSERT(!(ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED)));
	}
	return 0;
}